

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-utils.c
# Opt level: O1

int coda_format_from_string(char *str,coda_format *format)

{
  int iVar1;
  
  iVar1 = strcmp(str,"ascii");
  if (iVar1 == 0) {
    *format = coda_format_ascii;
  }
  else {
    iVar1 = strcmp(str,"binary");
    if (iVar1 == 0) {
      *format = coda_format_binary;
    }
    else {
      iVar1 = strcmp(str,"xml");
      if (iVar1 == 0) {
        *format = coda_format_xml;
      }
      else {
        iVar1 = strcmp(str,"hdf4");
        if (iVar1 == 0) {
          *format = coda_format_hdf4;
        }
        else {
          iVar1 = strcmp(str,"hdf5");
          if (iVar1 == 0) {
            *format = coda_format_hdf5;
          }
          else {
            iVar1 = strcmp(str,"cdf");
            if (iVar1 == 0) {
              *format = coda_format_cdf;
            }
            else {
              iVar1 = strcmp(str,"netcdf");
              if (iVar1 == 0) {
                *format = coda_format_netcdf;
              }
              else {
                iVar1 = strcmp(str,"grib");
                if (iVar1 == 0) {
                  *format = coda_format_grib;
                }
                else {
                  iVar1 = strcmp(str,"rinex");
                  if (iVar1 == 0) {
                    *format = coda_format_rinex;
                  }
                  else {
                    iVar1 = strcmp(str,"sp3");
                    if (iVar1 != 0) {
                      coda_set_error(-400,"invalid \'format\' attribute value \'%s\'",str);
                      return -1;
                    }
                    *format = coda_format_sp3;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int coda_format_from_string(const char *str, coda_format *format)
{
    if (strcmp(str, "ascii") == 0)
    {
        *format = coda_format_ascii;
    }
    else if (strcmp(str, "binary") == 0)
    {
        *format = coda_format_binary;
    }
    else if (strcmp(str, "xml") == 0)
    {
        *format = coda_format_xml;
    }
    else if (strcmp(str, "hdf4") == 0)
    {
        *format = coda_format_hdf4;
    }
    else if (strcmp(str, "hdf5") == 0)
    {
        *format = coda_format_hdf5;
    }
    else if (strcmp(str, "cdf") == 0)
    {
        *format = coda_format_cdf;
    }
    else if (strcmp(str, "netcdf") == 0)
    {
        *format = coda_format_netcdf;
    }
    else if (strcmp(str, "grib") == 0)
    {
        *format = coda_format_grib;
    }
    else if (strcmp(str, "rinex") == 0)
    {
        *format = coda_format_rinex;
    }
    else if (strcmp(str, "sp3") == 0)
    {
        *format = coda_format_sp3;
    }
    else
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "invalid 'format' attribute value '%s'", str);
        return -1;
    }

    return 0;
}